

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriter::writeComment(QXmlStreamWriter *this,QAnyStringView text)

{
  bool bVar1;
  QXmlStreamWriterPrivate *this_00;
  QAnyStringView *this_01;
  size_t in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QXmlStreamWriterPrivate *d;
  qsizetype in_stack_ffffffffffffff40;
  QXmlStreamWriterPrivate *pQVar2;
  char *in_stack_ffffffffffffff48;
  int *str;
  QAnyStringView *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff60;
  int level;
  QXmlStreamWriterPrivate *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 contents;
  QXmlStreamWriterPrivate *in_stack_ffffffffffffff80;
  int local_48 [2];
  void *local_40;
  undefined8 local_38;
  void *pvStack_30;
  int local_28;
  void *local_20;
  undefined8 local_18;
  void *pvStack_10;
  long local_8;
  
  level = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  contents = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RSI;
  pvStack_10 = in_RDX;
  this_00 = d_func((QXmlStreamWriter *)0x64f1ab);
  bVar1 = QXmlStreamWriterPrivate::finishStartElement(in_stack_ffffffffffffff80,(bool)contents);
  if ((!bVar1) && ((*(ushort *)&this_00->field_0x78 >> 7 & 1) != 0)) {
    QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::size
              (&(this_00->super_QXmlStreamPrivateTagStack).tagStack);
    QXmlStreamWriterPrivate::indent(in_stack_ffffffffffffff68,level);
  }
  pQVar2 = this_00;
  std::data<char_const,5ul>((char (*) [5])"<!--");
  QtPrivate::lengthHelperContainer<char,5ul>((char (*) [5])0x64f243);
  QAnyStringView::QAnyStringView<char,_true>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  QXmlStreamWriterPrivate::write(pQVar2,local_28,local_20,in_RCX);
  local_38 = local_18;
  pvStack_30 = pvStack_10;
  QXmlStreamWriterPrivate::write(this_00,(int)local_18,pvStack_10,in_RCX);
  str = local_48;
  pQVar2 = this_00;
  this_01 = (QAnyStringView *)std::data<char_const,4ul>((char (*) [4])"-->");
  QtPrivate::lengthHelperContainer<char,4ul>((char (*) [4])0x64f2f4);
  QAnyStringView::QAnyStringView<char,_true>(this_01,(char *)str,(qsizetype)pQVar2);
  QXmlStreamWriterPrivate::write(pQVar2,local_48[0],local_40,in_RCX);
  *(ushort *)&this_00->field_0x78 = *(ushort *)&this_00->field_0x78 & 0xfff7;
  *(ushort *)&this_00->field_0x78 = *(ushort *)&this_00->field_0x78 & 0xfffd;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeComment(QAnyStringView text)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(!contains(text, "--"_L1) && !endsWith(text, '-'));
    if (!d->finishStartElement(false) && d->autoFormatting)
        d->indent(d->tagStack.size());
    d->write("<!--");
    d->write(text);
    d->write("-->");
    d->inStartElement = d->lastWasStartElement = false;
}